

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O2

string * tinyusdz::unwrap(string *__return_storage_ptr__,string *str,string *l,string *r)

{
  string sStack_38;
  
  removeSuffix(&sStack_38,str,r);
  removePrefix((string *)__return_storage_ptr__,(string *)&sStack_38,(string *)l);
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

inline std::string unwrap(const std::string &str, const std::string &l,
                          const std::string &r) {
  return removePrefix(removeSuffix(str, r), l);
}